

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListIteratorTest_crbegin_crend_backward_Test::TestBody
          (IntrusiveListIteratorTest_crbegin_crend_backward_Test *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator<int> local_bd;
  int local_bc [3];
  iterator local_b0;
  size_type local_a8;
  vector<int,_std::allocator<int>_> local_a0;
  undefined1 local_88 [16];
  undefined1 local_78 [20];
  int local_64 [3];
  iterator local_58;
  size_type local_50;
  vector<int,_std::allocator<int>_> local_48;
  undefined1 local_30 [16];
  intrusive_list<(anonymous_namespace)::TestObject> local_20;
  IntrusiveListIteratorTest_crbegin_crend_backward_Test *this_local;
  
  local_20.size_ = (size_t)this;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::crbegin
            ((intrusive_list<(anonymous_namespace)::TestObject> *)(local_30 + 0x10));
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::crend
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_30);
  local_64[0] = 1;
  local_64[1] = 2;
  local_64[2] = 3;
  local_58 = local_64;
  local_50 = 3;
  std::allocator<int>::allocator((allocator<int> *)(local_78 + 0x13));
  __l_00._M_len = local_50;
  __l_00._M_array = local_58;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,__l_00,(allocator_type *)(local_78 + 0x13));
  (anonymous_namespace)::IntrusiveListIteratorTest::
  TestBackward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
            ((IntrusiveListIteratorTest *)this,
             (reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
              *)(local_30 + 0x10),
             (reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
              *)local_30,&local_48);
  std::vector<int,_std::allocator<int>_>::~vector(&local_48);
  std::allocator<int>::~allocator((allocator<int> *)(local_78 + 0x13));
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::crbegin
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_78);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::crend
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_88);
  local_bc[0] = 1;
  local_bc[1] = 2;
  local_bc[2] = 3;
  local_b0 = local_bc;
  local_a8 = 3;
  std::allocator<int>::allocator(&local_bd);
  __l._M_len = local_a8;
  __l._M_array = local_b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_a0,__l,&local_bd);
  (anonymous_namespace)::IntrusiveListIteratorTest::
  TestBackward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
            ((IntrusiveListIteratorTest *)this,
             (reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
              *)local_78,
             (reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
              *)local_88,&local_a0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_a0);
  std::allocator<int>::~allocator(&local_bd);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, crbegin_crend_backward) {
  TestBackward(list_.crbegin(), list_.crend(), {1, 2, 3});
  TestBackward(clist_.crbegin(), clist_.crend(), {1, 2, 3});
}